

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O0

void VOX_AddVoxel(int sprnum,int frame,FVoxelDef *def)

{
  spritedef_t *psVar1;
  spriteframe_t *psVar2;
  FVoxelDef *def_local;
  int frame_local;
  int sprnum_local;
  
  psVar1 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)sprnum);
  R_ExtendSpriteFrames(psVar1,frame);
  psVar1 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)sprnum);
  psVar2 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                     (&SpriteFrames,(long)(int)((uint)psVar1->spriteframes + frame));
  psVar2->Voxel = def;
  return;
}

Assistant:

void VOX_AddVoxel(int sprnum, int frame, FVoxelDef *def)
{
	R_ExtendSpriteFrames(sprites[sprnum], frame);
	SpriteFrames[sprites[sprnum].spriteframes + frame].Voxel = def;
}